

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fastpfor.cpp
# Opt level: O1

void __thiscall
FastPForLib::FastPForTest_fastpack_7_except_63_Test::~FastPForTest_fastpack_7_except_63_Test
          (FastPForTest_fastpack_7_except_63_Test *this)

{
  pointer piVar1;
  pointer plVar2;
  _func_int **pp_Var3;
  GTestFlagSaver *pGVar4;
  
  this[-1].super_FastPForTest.out64.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&PTR__FastPForTest_001b3720;
  (this->super_FastPForTest).
  super_TestWithParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__FastPForTest_001b3760;
  piVar1 = (this->super_FastPForTest).out32.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->super_FastPForTest).out64.
                                 super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_start - (long)piVar1);
  }
  plVar2 = (this->super_FastPForTest).in64.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (plVar2 != (pointer)0x0) {
    operator_delete(plVar2,(long)(this->super_FastPForTest).out32.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start - (long)plVar2);
  }
  piVar1 = (this->super_FastPForTest).in32.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)(this->super_FastPForTest).in64.
                                 super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_start - (long)piVar1);
  }
  pp_Var3 = (this->super_FastPForTest).
            super_TestWithParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .
            super_WithParamInterface<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._vptr_WithParamInterface;
  if (pp_Var3 != (_func_int **)0x0) {
    operator_delete(pp_Var3,(long)(this->super_FastPForTest).in32.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start - (long)pp_Var3);
  }
  pGVar4 = (this->super_FastPForTest).
           super_TestWithParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .super_Test.gtest_flag_saver_._M_t.
           super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
           .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl;
  if (pGVar4 != (GTestFlagSaver *)0x0) {
    (**(code **)(*(long *)pGVar4 + 0x28))();
  }
  (this->super_FastPForTest).
  super_TestWithParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .super_Test.gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)0x0;
  testing::Test::~Test
            ((Test *)&this[-1].super_FastPForTest.out64.
                      super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  return;
}

Assistant:

TEST_P(FastPForTest, fastpack_7_except_63) {
    _genDataWithFixBits64(in64, 7, 256);
    std::vector<int64_t> excepts;
    _genDataWithFixBits64(excepts, 63, 6);
    in64[0] = excepts[0];
    in64[10] = excepts[1];
    in64[100] = excepts[2];
    in64[133] = excepts[3];
    in64[177] = excepts[4];
    in64[213] = excepts[5];
    _verify64();
  }